

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftstroke.c
# Opt level: O3

FT_Error ft_stroke_border_lineto(FT_StrokeBorder border,FT_Vector *to,FT_Bool movable)

{
  FT_UInt FVar1;
  FT_Vector *pFVar2;
  FT_Byte *pFVar3;
  FT_Pos FVar4;
  uint uVar5;
  FT_Error FVar6;
  
  if (border->movable == '\0') {
    if (border->num_points != 0) {
      uVar5 = border->num_points - 1;
      if (((border->points[uVar5].x - to->x) + 1U < 3) &&
         ((border->points[uVar5].y - to->y) + 1U < 3)) {
        return 0;
      }
    }
    FVar6 = ft_stroke_border_grow(border,1);
    if (FVar6 != 0) goto LAB_001f36f7;
    pFVar2 = border->points;
    uVar5 = border->num_points;
    pFVar3 = border->tags;
    FVar4 = to->y;
    pFVar2[uVar5].x = to->x;
    pFVar2[uVar5].y = FVar4;
    pFVar3[uVar5] = '\x01';
    border->num_points = border->num_points + 1;
  }
  else {
    pFVar2 = border->points;
    FVar1 = border->num_points;
    FVar4 = to->y;
    pFVar2[FVar1 - 1].x = to->x;
    pFVar2[FVar1 - 1].y = FVar4;
  }
  FVar6 = 0;
LAB_001f36f7:
  border->movable = movable;
  return FVar6;
}

Assistant:

static FT_Error
  ft_stroke_border_lineto( FT_StrokeBorder  border,
                           FT_Vector*       to,
                           FT_Bool          movable )
  {
    FT_Error  error = FT_Err_Ok;


    FT_ASSERT( border->start >= 0 );

    if ( border->movable )
    {
      /* move last point */
      border->points[border->num_points - 1] = *to;
    }
    else
    {
      /* don't add zero-length lineto */
      if ( border->num_points > 0                                          &&
           FT_IS_SMALL( border->points[border->num_points - 1].x - to->x ) &&
           FT_IS_SMALL( border->points[border->num_points - 1].y - to->y ) )
        return error;

      /* add one point */
      error = ft_stroke_border_grow( border, 1 );
      if ( !error )
      {
        FT_Vector*  vec = border->points + border->num_points;
        FT_Byte*    tag = border->tags   + border->num_points;


        vec[0] = *to;
        tag[0] = FT_STROKE_TAG_ON;

        border->num_points += 1;
      }
    }
    border->movable = movable;
    return error;
  }